

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

int __thiscall xmrig::CudaBackendPrivate::init(CudaBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer pCVar2;
  _Alloc_hider _Var3;
  int iVar4;
  uint32_t uVar5;
  int extraout_EAX;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  char *pcVar9;
  pointer extraout_RAX;
  pointer pCVar10;
  ulong uVar11;
  undefined4 extraout_var;
  size_t sVar12;
  size_t sVar13;
  pointer extraout_RAX_00;
  uint32_t version;
  uint32_t version_00;
  pointer this_00;
  string local_70;
  string local_50;
  
  if (*ctx == (EVP_PKEY_CTX)0x0) {
    pcVar9 = "";
    goto LAB_00174a9c;
  }
  iVar4 = CudaLib::init(*(EVP_PKEY_CTX **)(ctx + 0x20));
  if ((char)iVar4 == '\0') {
    pcVar9 = "\x1b[0;31m (failed to load CUDA plugin)";
    goto LAB_00174a9c;
  }
  uVar5 = CudaLib::runtimeVersion();
  this->runtimeVersion = uVar5;
  uVar5 = CudaLib::driverVersion();
  this->driverVersion = uVar5;
  if ((uVar5 != 0) && (this->runtimeVersion != 0)) {
    uVar5 = CudaLib::deviceCount();
    if (uVar5 != 0) {
      pCVar10 = (this->devices).
                super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pCVar10 !=
          (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_00174a5f;
      CudaLib::devices((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)&local_70,
                       *(int32_t *)(ctx + 0x60),*(int32_t *)(ctx + 100),
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ctx + 8));
      std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::_M_move_assign
                (&this->devices,&local_70);
      std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector
                ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)&local_70);
      if ((this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        printDisabled("CUDA","\x1b[0;31m (no devices)");
        pCVar10 = extraout_RAX;
        goto LAB_00174a5f;
      }
      CudaLib::version_abi_cxx11_(&local_70,(CudaLib *)(ulong)this->runtimeVersion,version);
      _Var3._M_p = local_70._M_dataplus._M_p;
      CudaLib::version_abi_cxx11_(&local_50,(CudaLib *)(ulong)this->driverVersion,version_00);
      pcVar9 = CudaLib::pluginVersion();
      Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m\x1b[1;30m/%s\x1b[0m"
                 ,"CUDA",_Var3._M_p,local_50._M_dataplus._M_p,pcVar9);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (ctx[0x68] == (EVP_PKEY_CTX)0x1) {
        iVar4 = NvmlLib::init(*(EVP_PKEY_CTX **)(ctx + 0x70));
        if ((char)iVar4 == '\0') {
          pcVar9 = "\x1b[0;31m (failed to load NVML)";
          goto LAB_00174bc1;
        }
        NvmlLib::assign(&this->devices);
        Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;32m%s\x1b[0m press \x1b[45m\x1b[1;37me\x1b[0m for health report"
                   ,"NVML",NvmlLib::m_nvmlVersion,NvmlLib::m_driverVersion);
      }
      else {
        pcVar9 = "";
LAB_00174bc1:
        printDisabled("NVML",pcVar9);
      }
      pCVar2 = (this->devices).
               super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pCVar10 = pCVar2;
      for (this_00 = (this->devices).
                     super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_00 != pCVar2;
          this_00 = this_00 + 1) {
        uVar1 = this_00->m_index;
        PciTopology::toString((PciTopology *)&local_70);
        _Var3._M_p = local_70._M_dataplus._M_p;
        pcVar9 = (this_00->m_name).m_data;
        uVar11 = CudaDevice::clock(this_00);
        uVar5 = CudaDevice::memoryClock(this_00);
        uVar6 = CudaDevice::smx(this_00);
        uVar7 = CudaDevice::computeCapability(this_00,true);
        uVar8 = CudaDevice::computeCapability(this_00,false);
        sVar12 = CudaDevice::freeMemSize(this_00);
        sVar13 = CudaDevice::globalMemSize(this_00);
        Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m\x1b[1;32m %s \x1b[0m\x1b[1;37m%u/%u MHz\x1b[0m smx:\x1b[1;37m%u\x1b[0m arch:\x1b[1;37m%u%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                   ,"CUDA GPU",(ulong)uVar1,_Var3._M_p,pcVar9,uVar11 & 0xffffffff,
                   CONCAT44(extraout_var,uVar5),(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,
                   sVar12 >> 0x14,sVar13 >> 0x14);
        String::~String((String *)&local_70);
        pCVar10 = extraout_RAX_00;
      }
LAB_00174a5f:
      return (int)pCVar10;
    }
  }
  pcVar9 = "\x1b[0;31m (no devices)";
LAB_00174a9c:
  printDisabled("CUDA",pcVar9);
  return extraout_EAX;
}

Assistant:

void init(const CudaConfig &cuda)
    {
        if (!cuda.isEnabled()) {
            return printDisabled(kLabel, "");
        }

        if (!CudaLib::init(cuda.loader())) {
            return printDisabled(kLabel, RED_S " (failed to load CUDA plugin)");
        }

        runtimeVersion = CudaLib::runtimeVersion();
        driverVersion  = CudaLib::driverVersion();

        if (!runtimeVersion || !driverVersion || !CudaLib::deviceCount()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        if (!devices.empty()) {
            return;
        }

        devices = CudaLib::devices(cuda.bfactor(), cuda.bsleep(), cuda.devicesHint());
        if (devices.empty()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" WHITE_BOLD("%s") BLACK_BOLD("/%s"), kLabel,
                   CudaLib::version(runtimeVersion).c_str(), CudaLib::version(driverVersion).c_str(), CudaLib::pluginVersion());

#       ifdef XMRIG_FEATURE_NVML
        if (cuda.isNvmlEnabled()) {
            if (NvmlLib::init(cuda.nvmlLoader())) {
                NvmlLib::assign(devices);

                Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" GREEN_BOLD("%s") " press " MAGENTA_BG(WHITE_BOLD_S "e") " for health report",
                           kNvmlLabel,
                           NvmlLib::version(),
                           NvmlLib::driverVersion()
                           );
            }
            else {
                printDisabled(kNvmlLabel, RED_S " (failed to load NVML)");
            }
        }
        else {
            printDisabled(kNvmlLabel, "");
        }
#       endif

        for (const CudaDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") GREEN_BOLD(" %s ") WHITE_BOLD("%u/%u MHz") " smx:" WHITE_BOLD("%u") " arch:" WHITE_BOLD("%u%u") " mem:" CYAN("%zu/%zu") " MB",
                       "CUDA GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.name().data(),
                       device.clock(),
                       device.memoryClock(),
                       device.smx(),
                       device.computeCapability(true),
                       device.computeCapability(false),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }